

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void parse_preshader(Context *ctx,uint32 *tokens,uint32 tokcount)

{
  uint32 uVar1;
  MOJOSHADER_symbol *pMVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint32 *puVar7;
  MOJOSHADER_preshader *__s;
  double *pdVar8;
  MOJOSHADER_preshaderInstruction *pMVar9;
  uint *puVar10;
  float *pfVar11;
  size_t len_2;
  uint val;
  uint32 symcount;
  MOJOSHADER_symbol *sym;
  uint largest;
  uint32 count_1;
  uint32 base_1;
  uint32 ltljmp;
  uint32 bigjmp;
  uint32 jmp;
  uint32 siz;
  uint32 count;
  uint32 base;
  uint32 symcount_1;
  MOJOSHADER_symbol *sym_1;
  uint32 numarrays;
  uint item;
  MOJOSHADER_preshaderOperand *operand;
  MOJOSHADER_preshaderOpcode local_e8;
  uint32 operand_count;
  MOJOSHADER_preshaderOpcode opcode;
  uint32 opcodetok;
  MOJOSHADER_preshaderInstruction *inst;
  size_t len;
  undefined1 local_c8 [4];
  uint32 opcode_count;
  CtabData ctabdata;
  uint32 *output_map;
  uint32 output_map_count;
  double *litptr;
  size_t len_1;
  uint32 lit_count;
  MOJOSHADER_preshader *preshader;
  uint32 nexttokcount;
  uint32 *nexttokens;
  uint32 *puStack_70;
  uint32 subtokcount;
  PreshaderBlockInfo clit;
  PreshaderBlockInfo fxlc;
  PreshaderBlockInfo prsi;
  PreshaderBlockInfo ctab;
  uint32 version;
  uint32 max_version;
  uint32 min_version;
  uint32 version_magic;
  uint32 i;
  uint32 tokcount_local;
  uint32 *tokens_local;
  Context *ctx_local;
  
  if (ctx->have_preshader != 0) {
    __assert_fail("ctx->have_preshader == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                  ,0x29c0,"void parse_preshader(Context *, const uint32 *, uint32)");
  }
  ctx->have_preshader = 1;
  uVar6 = *tokens;
  if ((uVar6 < 0x46580200) || (0x46580201 < uVar6)) {
    fail(ctx,"Unsupported preshader version.");
  }
  else {
    _i = tokens + 1;
    version_magic = tokcount - 1;
    memset(&prsi.tokcount,0,0x10);
    memset(&fxlc.tokcount,0,0x10);
    memset(&clit.tokcount,0,0x10);
    memset(&stack0xffffffffffffff90,0,0x10);
    while (version_magic != 0) {
      nexttokens._4_4_ = 0;
      iVar3 = is_comment_token(ctx,*_i,(uint32 *)((long)&nexttokens + 4));
      if ((iVar3 == 0) || (version_magic < nexttokens._4_4_)) {
        fail(ctx,"Bogus preshader data.");
        return;
      }
      puVar7 = _i + 1;
      _i = puVar7 + nexttokens._4_4_;
      version_magic = (version_magic - 1) - nexttokens._4_4_;
      if (nexttokens._4_4_ != 0) {
        uVar1 = *puVar7;
        if (uVar1 == 0x42415443) {
          if (ctab.tokens._4_4_ != 0) {
            fail(ctx,"Multiple CTAB preshader blocks.");
            return;
          }
          ctab.tokens._0_4_ = nexttokens._4_4_;
          ctab.tokens._4_4_ = 1;
          prsi._8_8_ = puVar7;
        }
        else if (uVar1 == 0x434c5846) {
          if (fxlc.tokens._4_4_ != 0) {
            fail(ctx,"Multiple FXLC preshader blocks.");
            return;
          }
          fxlc.tokens._0_4_ = nexttokens._4_4_;
          fxlc.tokens._4_4_ = 1;
          clit._8_8_ = puVar7;
        }
        else if (uVar1 == 0x49535250) {
          if (prsi.tokens._4_4_ != 0) {
            fail(ctx,"Multiple PRSI preshader blocks.");
            return;
          }
          prsi.tokens._0_4_ = nexttokens._4_4_;
          prsi.tokens._4_4_ = 1;
          fxlc._8_8_ = puVar7;
        }
        else {
          if (uVar1 != 0x54494c43) {
            fail(ctx,"Bogus preshader section.");
            return;
          }
          if (clit.tokens._4_4_ != 0) {
            fail(ctx,"Multiple CLIT preshader blocks.");
            return;
          }
          clit.tokens._0_4_ = nexttokens._4_4_;
          clit.tokens._4_4_ = 1;
          puStack_70 = puVar7;
        }
      }
    }
    if (ctab.tokens._4_4_ == 0) {
      fail(ctx,"No CTAB block in preshader.");
    }
    else if (fxlc.tokens._4_4_ == 0) {
      fail(ctx,"No FXLC block in preshader.");
    }
    else if (clit.tokens._4_4_ == 0) {
      fail(ctx,"No CLIT block in preshader.");
    }
    else {
      __s = (MOJOSHADER_preshader *)Malloc(ctx,0x58);
      if (__s != (MOJOSHADER_preshader *)0x0) {
        memset(__s,0,0x58);
        __s->malloc = ctx->malloc;
        __s->free = ctx->free;
        __s->malloc_data = ctx->malloc_data;
        ctx->preshader = __s;
        if ((uint)clit.tokens == 0) {
          fail(ctx,"Bogus CLIT block in preshader.");
        }
        else {
          uVar4 = puStack_70[1];
          if ((uint)clit.tokens - 2 >> 1 < uVar4) {
            fail(ctx,"Bogus CLIT block in preshader.");
            return;
          }
          if (uVar4 != 0) {
            __s->literal_count = uVar4;
            pdVar8 = (double *)Malloc(ctx,(ulong)uVar4 << 3);
            __s->literals = pdVar8;
            if (__s->literals == (double *)0x0) {
              return;
            }
            for (min_version = 0; min_version < uVar4; min_version = min_version + 1) {
              __s->literals[min_version] = *(double *)(puStack_70 + (ulong)min_version * 2 + 2);
            }
          }
        }
        output_map._4_4_ = 0;
        ctabdata.symbols = (MOJOSHADER_symbol *)0x0;
        pMVar2 = ctabdata.symbols;
        if (prsi.tokens._4_4_ != 0) {
          if ((uint)prsi.tokens < 8) {
            fail(ctx,"Bogus preshader PRSI data");
            return;
          }
          output_map._4_4_ = *(uint *)(fxlc._8_8_ + 0x1c);
          prsi.tokens._0_4_ = (uint)prsi.tokens - 8;
          fxlc._8_8_ = fxlc._8_8_ + 0x20;
          pMVar2 = (MOJOSHADER_symbol *)fxlc._8_8_;
          if ((uint)prsi.tokens < (output_map._4_4_ + 1) * 2) {
            fail(ctx,"Bogus preshader PRSI data");
            return;
          }
        }
        ctabdata.symbols = pMVar2;
        memset(local_c8,0,0x10);
        parse_constant_table
                  (ctx,(uint32 *)(prsi._8_8_ + -4),(uint)ctab.tokens << 2,uVar6,0,
                   (CtabData *)local_c8);
        __s->symbol_count = opcode_count;
        __s->symbols = (MOJOSHADER_symbol *)ctabdata._0_8_;
        if (local_c8 == (undefined1  [4])0x0) {
          fail(ctx,"Bogus preshader CTAB data");
        }
        else {
          len._4_4_ = *(uint *)(clit._8_8_ + 4);
          __s->instruction_count = len._4_4_;
          pMVar9 = (MOJOSHADER_preshaderInstruction *)Malloc(ctx,(ulong)len._4_4_ * 0x70);
          __s->instructions = pMVar9;
          if (__s->instructions != (MOJOSHADER_preshaderInstruction *)0x0) {
            memset(__s->instructions,0,(ulong)len._4_4_ * 0x70);
            clit._8_8_ = clit._8_8_ + 8;
            fxlc.tokens._0_4_ = (uint)fxlc.tokens - 2;
            if ((uint)fxlc.tokens >> 1 < len._4_4_) {
              fail(ctx,"Bogus preshader FXLC block.");
            }
            else {
              _opcode = __s->instructions;
              while (len._4_4_ != 0) {
                uVar6 = *(uint *)clit._8_8_;
                local_e8 = MOJOSHADER_PRESHADEROP_NOP;
                uVar4 = uVar6 >> 0x10;
                if (uVar4 == 0x1000) {
                  local_e8 = MOJOSHADER_PRESHADEROP_MOV;
                }
                else if (uVar4 == 0x1010) {
                  local_e8 = MOJOSHADER_PRESHADEROP_NEG;
                }
                else if (uVar4 == 0x1030) {
                  local_e8 = MOJOSHADER_PRESHADEROP_RCP;
                }
                else if (uVar4 == 0x1040) {
                  local_e8 = MOJOSHADER_PRESHADEROP_FRC;
                }
                else if (uVar4 == 0x1050) {
                  local_e8 = MOJOSHADER_PRESHADEROP_EXP;
                }
                else if (uVar4 == 0x1060) {
                  local_e8 = MOJOSHADER_PRESHADEROP_LOG;
                }
                else if (uVar4 == 0x1070) {
                  local_e8 = MOJOSHADER_PRESHADEROP_RSQ;
                }
                else if (uVar4 == 0x1080) {
                  local_e8 = MOJOSHADER_PRESHADEROP_SIN;
                }
                else if (uVar4 == 0x1090) {
                  local_e8 = MOJOSHADER_PRESHADEROP_COS;
                }
                else if (uVar4 == 0x10a0) {
                  local_e8 = MOJOSHADER_PRESHADEROP_ASIN;
                }
                else if (uVar4 == 0x10b0) {
                  local_e8 = MOJOSHADER_PRESHADEROP_ACOS;
                }
                else if (uVar4 == 0x10c0) {
                  local_e8 = MOJOSHADER_PRESHADEROP_ATAN;
                }
                else if (uVar4 == 0x2000) {
                  local_e8 = MOJOSHADER_PRESHADEROP_MIN;
                }
                else if (uVar4 == 0x2010) {
                  local_e8 = MOJOSHADER_PRESHADEROP_MAX;
                }
                else if (uVar4 == 0x2020) {
                  local_e8 = MOJOSHADER_PRESHADEROP_LT;
                }
                else if (uVar4 == 0x2030) {
                  local_e8 = MOJOSHADER_PRESHADEROP_GE;
                }
                else if (uVar4 == 0x2040) {
                  local_e8 = MOJOSHADER_PRESHADEROP_ADD;
                }
                else if (uVar4 == 0x2050) {
                  local_e8 = MOJOSHADER_PRESHADEROP_MUL;
                }
                else if (uVar4 == 0x2060) {
                  local_e8 = MOJOSHADER_PRESHADEROP_ATAN2;
                }
                else if (uVar4 == 0x2080) {
                  local_e8 = MOJOSHADER_PRESHADEROP_DIV;
                }
                else if (uVar4 == 0x3000) {
                  local_e8 = MOJOSHADER_PRESHADEROP_CMP;
                }
                else if (uVar4 == 0x3010) {
                  local_e8 = MOJOSHADER_PRESHADEROP_MOVC;
                }
                else if (uVar4 == 0x5000) {
                  local_e8 = MOJOSHADER_PRESHADEROP_DOT;
                }
                else if (uVar4 == 0x5020) {
                  local_e8 = MOJOSHADER_PRESHADEROP_NOISE;
                }
                else if (uVar4 == 0xa000) {
                  local_e8 = MOJOSHADER_PRESHADEROP_MIN_SCALAR;
                }
                else if (uVar4 == 0xa010) {
                  local_e8 = MOJOSHADER_PRESHADEROP_MAX_SCALAR;
                }
                else if (uVar4 == 0xa020) {
                  local_e8 = MOJOSHADER_PRESHADEROP_LT_SCALAR;
                }
                else if (uVar4 == 0xa030) {
                  local_e8 = MOJOSHADER_PRESHADEROP_GE_SCALAR;
                }
                else if (uVar4 == 0xa040) {
                  local_e8 = MOJOSHADER_PRESHADEROP_ADD_SCALAR;
                }
                else if (uVar4 == 0xa050) {
                  local_e8 = MOJOSHADER_PRESHADEROP_MUL_SCALAR;
                }
                else if (uVar4 == 0xa060) {
                  local_e8 = MOJOSHADER_PRESHADEROP_ATAN2_SCALAR;
                }
                else if (uVar4 == 0xa080) {
                  local_e8 = MOJOSHADER_PRESHADEROP_DIV_SCALAR;
                }
                else if (uVar4 == 0xd000) {
                  local_e8 = MOJOSHADER_PRESHADEROP_DOT_SCALAR;
                }
                else if (uVar4 == 0xd020) {
                  local_e8 = MOJOSHADER_PRESHADEROP_NOISE_SCALAR;
                }
                else {
                  fail(ctx,"Unknown preshader opcode.");
                }
                operand._4_4_ = *(int *)(clit._8_8_ + 4) + 1;
                _opcode->opcode = local_e8;
                _opcode->element_count = uVar6 & 0xff;
                _opcode->operand_count = operand._4_4_;
                clit._8_8_ = clit._8_8_ + 8;
                fxlc.tokens._0_4_ = (uint)fxlc.tokens - 2;
                if ((uint)fxlc.tokens < operand._4_4_ * 3) {
                  fail(ctx,"Bogus preshader FXLC block.");
                  return;
                }
                _numarrays = _opcode->operands;
                while (operand._4_4_ != 0) {
                  uVar6 = *(uint *)(clit._8_8_ + 8);
                  uVar4 = *(uint *)clit._8_8_;
                  switch(*(undefined4 *)(clit._8_8_ + 4)) {
                  case 1:
                    if (__s->literal_count < uVar6) {
                      fail(ctx,"Bogus preshader literal index.");
                    }
                    else {
                      _numarrays->type = MOJOSHADER_PRESHADEROPERAND_LITERAL;
                    }
                    break;
                  case 2:
                    base = ctabdata.have_ctab;
                    symcount_1 = ctabdata.symbol_count;
                    for (min_version = 0; min_version < opcode_count; min_version = min_version + 1)
                    {
                      uVar5 = *(int *)(_base + 0xc) * 4;
                      if (*(int *)(_base + 8) != 2) {
                        __assert_fail("sym->register_set==MOJOSHADER_SYMREGSET_FLOAT4",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                                      ,0x2ac8,
                                      "void parse_preshader(Context *, const uint32 *, uint32)");
                      }
                      if ((uVar5 <= uVar6) && (uVar6 < uVar5 + *(int *)(_base + 0x10) * 4)) break;
                      _base = _base + 0x38;
                    }
                    if (min_version == opcode_count) {
                      fail(ctx,"Bogus preshader input index.");
                    }
                    else {
                      _numarrays->type = MOJOSHADER_PRESHADEROPERAND_INPUT;
                      if (uVar4 != 0) {
                        _numarrays->array_register_count = uVar4;
                        puVar10 = (uint *)Malloc(ctx,(ulong)(uVar4 << 2));
                        _numarrays->array_registers = puVar10;
                        memset(_numarrays->array_registers,0,(ulong)(uVar4 << 2));
                        for (min_version = 0; min_version < uVar4; min_version = min_version + 1) {
                          _numarrays->array_registers[min_version] =
                               (*(uint *)(clit._8_8_ + 0x10) >> 4) * 4 +
                               (*(uint *)(clit._8_8_ + 0x10) >> 2 & 3);
                          clit._8_8_ = clit._8_8_ + 8;
                          fxlc.tokens._0_4_ = (uint)fxlc.tokens - 2;
                        }
                      }
                    }
                    break;
                  case 4:
                    _numarrays->type = MOJOSHADER_PRESHADEROPERAND_OUTPUT;
                    for (min_version = 0; min_version < output_map._4_4_;
                        min_version = min_version + 1) {
                      uVar4 = *(int *)((long)&(ctabdata.symbols)->name +
                                      (ulong)(min_version << 1) * 4) * 4;
                      if ((uVar4 <= uVar6) &&
                         (uVar6 < uVar4 + *(int *)((long)&(ctabdata.symbols)->name +
                                                  (ulong)(min_version * 2 + 1) * 4) * 4)) break;
                    }
                    if ((min_version == output_map._4_4_) && (prsi.tokens._4_4_ != 0)) {
                      fail(ctx,"Bogus preshader output index.");
                    }
                    break;
                  case 7:
                    _numarrays->type = MOJOSHADER_PRESHADEROPERAND_TEMP;
                    if (__s->temp_count <= uVar6) {
                      __s->temp_count = uVar6 + 1;
                    }
                  }
                  _numarrays->index = uVar6;
                  clit._8_8_ = clit._8_8_ + 0xc;
                  fxlc.tokens._0_4_ = (uint)fxlc.tokens - 3;
                  _numarrays = _numarrays + 1;
                  operand._4_4_ = operand._4_4_ - 1;
                }
                _opcode = _opcode + 1;
                len._4_4_ = len._4_4_ - 1;
              }
              __s->temp_count = __s->temp_count + 3 & 0xfffffffc;
              sym._0_4_ = 0;
              _val = __s->symbols;
              for (min_version = 0; min_version < __s->symbol_count; min_version = min_version + 1)
              {
                uVar6 = _val->register_index + _val->register_count;
                if ((uint)sym < uVar6) {
                  sym._0_4_ = uVar6;
                }
                _val = _val + 1;
              }
              if ((uint)sym != 0) {
                pfVar11 = (float *)Malloc(ctx,(ulong)(uint)sym << 4);
                __s->registers = pfVar11;
                memset(__s->registers,0,(ulong)(uint)sym << 4);
                __s->register_count = (uint)sym;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void parse_preshader(Context *ctx, const uint32 *tokens, uint32 tokcount)
{
#ifndef MOJOSHADER_EFFECT_SUPPORT
    fail(ctx, "Preshader found, but effect support is disabled!");
#else
    uint32 i;

    assert(ctx->have_preshader == 0);  // !!! FIXME: can you have more than one?
    ctx->have_preshader = 1;

    // !!! FIXME: I don't know what specific versions signify, but we need to
    // !!! FIXME:  save this to test against the CTAB version field, if
    // !!! FIXME:  nothing else.
    // !!! FIXME: 0x02 0x0? is probably the version (fx_2_?),
    // !!! FIXME:  and 0x4658 is the magic, like a real shader's version token.
    const uint32 version_magic = 0x46580000;
    const uint32 min_version = 0x00000200 | version_magic;
    const uint32 max_version = 0x00000201 | version_magic;
    const uint32 version = SWAP32(tokens[0]);
    if (version < min_version || version > max_version)
    {
        fail(ctx, "Unsupported preshader version.");
        return;  // fail because the shader will malfunction w/o this.
    } // if

    tokens++;
    tokcount--;

    // All sections of a preshader are packed into separate comment tokens,
    //  inside the containing comment token block. Find them all before
    //  we start, so we don't care about the order they appear in the file.
    PreshaderBlockInfo ctab = { 0, 0, 0 };
    PreshaderBlockInfo prsi = { 0, 0, 0 };
    PreshaderBlockInfo fxlc = { 0, 0, 0 };
    PreshaderBlockInfo clit = { 0, 0, 0 };

    while (tokcount > 0)
    {
        uint32 subtokcount = 0;
        if ( (!is_comment_token(ctx, *tokens, &subtokcount)) ||
             (subtokcount > tokcount) )
        {
            fail(ctx, "Bogus preshader data.");
            return;
        } // if

        tokens++;
        tokcount--;

        const uint32 *nexttokens = tokens + subtokcount;
        const uint32 nexttokcount = tokcount - subtokcount;

        if (subtokcount > 0)
        {
            switch (SWAP32(*tokens))
            {
                #define PRESHADER_BLOCK_CASE(id, var) \
                    case id##_ID: { \
                        if (var.seen) { \
                            fail(ctx, "Multiple " #id " preshader blocks."); \
                            return; \
                        } \
                        var.tokens = tokens; \
                        var.tokcount = subtokcount; \
                        var.seen = 1; \
                        break; \
                    }
                PRESHADER_BLOCK_CASE(CTAB, ctab);
                PRESHADER_BLOCK_CASE(PRSI, prsi);
                PRESHADER_BLOCK_CASE(FXLC, fxlc);
                PRESHADER_BLOCK_CASE(CLIT, clit);
                default: fail(ctx, "Bogus preshader section."); return;
                #undef PRESHADER_BLOCK_CASE
            } // switch
        } // if

        tokens = nexttokens;
        tokcount = nexttokcount;
    } // while

    if (!ctab.seen) { fail(ctx, "No CTAB block in preshader."); return; }
    if (!fxlc.seen) { fail(ctx, "No FXLC block in preshader."); return; }
    if (!clit.seen) { fail(ctx, "No CLIT block in preshader."); return; }
    // prsi.seen is optional, apparently.

    MOJOSHADER_preshader *preshader = (MOJOSHADER_preshader *)
                                    Malloc(ctx, sizeof (MOJOSHADER_preshader));
    if (preshader == NULL)
        return;

    memset(preshader, '\0', sizeof (MOJOSHADER_preshader));
    preshader->malloc = ctx->malloc;
    preshader->free = ctx->free;
    preshader->malloc_data = ctx->malloc_data;

    ctx->preshader = preshader;

    // Let's set up the constant literals first...
    if (clit.tokcount == 0)
        fail(ctx, "Bogus CLIT block in preshader.");
    else
    {
        const uint32 lit_count = SWAP32(clit.tokens[1]);
        if (lit_count > ((clit.tokcount - 2) / 2))
        {
            fail(ctx, "Bogus CLIT block in preshader.");
            return;
        } // if
        else if (lit_count > 0)
        {
            preshader->literal_count = (unsigned int) lit_count;
            assert(sizeof (double) == 8);  // just in case.
            const size_t len = sizeof (double) * lit_count;
            preshader->literals = (double *) Malloc(ctx, len);
            if (preshader->literals == NULL)
                return;  // oh well.
            const double *litptr = (const double *) (clit.tokens + 2);
            for (i = 0; i < lit_count; i++)
                preshader->literals[i] = SWAPDBL(litptr[i]);
        } // else if
    } // else

    // Parse out the PRSI block. This is used to map the output registers.
    uint32 output_map_count = 0;
    const uint32 *output_map = NULL;
    if (prsi.seen)
    {
        if (prsi.tokcount < 8)
        {
            fail(ctx, "Bogus preshader PRSI data");
            return;
        } // if

        //const uint32 first_output_reg = SWAP32(prsi.tokens[1]);
        // !!! FIXME: there are a lot of fields here I don't know about.
        // !!! FIXME:  maybe [2] and [3] are for int4 and bool registers?
        //const uint32 output_reg_count = SWAP32(prsi.tokens[4]);
        // !!! FIXME:  maybe [5] and [6] are for int4 and bool registers?
        output_map_count = SWAP32(prsi.tokens[7]);

        prsi.tokcount -= 8;
        prsi.tokens += 8;

        if (prsi.tokcount < ((output_map_count + 1) * 2))
        {
            fail(ctx, "Bogus preshader PRSI data");
            return;
        } // if

        output_map = prsi.tokens;
    } // if

    // Now we'll figure out the CTAB...
    CtabData ctabdata = { 0, 0, 0 };
    parse_constant_table(ctx, ctab.tokens - 1, ctab.tokcount * 4,
                         version, 0, &ctabdata);

    // preshader owns this now. Don't free it in this function.
    preshader->symbol_count = ctabdata.symbol_count;
    preshader->symbols = ctabdata.symbols;

    if (!ctabdata.have_ctab)
    {
        fail(ctx, "Bogus preshader CTAB data");
        return;
    } // if

    // The FXLC block has the actual instructions...
    uint32 opcode_count = SWAP32(fxlc.tokens[1]);

    const size_t len = sizeof (MOJOSHADER_preshaderInstruction) * opcode_count;
    preshader->instruction_count = (unsigned int) opcode_count;
    preshader->instructions = (MOJOSHADER_preshaderInstruction *) Malloc(ctx, len);
    if (preshader->instructions == NULL)
        return;
    memset(preshader->instructions, '\0', len);

    fxlc.tokens += 2;
    fxlc.tokcount -= 2;
    if (opcode_count > (fxlc.tokcount / 2))
    {
        fail(ctx, "Bogus preshader FXLC block.");
        return;
    } // if

    MOJOSHADER_preshaderInstruction *inst = preshader->instructions;
    while (opcode_count--)
    {
        const uint32 opcodetok = SWAP32(fxlc.tokens[0]);
        MOJOSHADER_preshaderOpcode opcode = MOJOSHADER_PRESHADEROP_NOP;
        switch ((opcodetok >> 16) & 0xFFFF)
        {
            case 0x1000: opcode = MOJOSHADER_PRESHADEROP_MOV; break;
            case 0x1010: opcode = MOJOSHADER_PRESHADEROP_NEG; break;
            case 0x1030: opcode = MOJOSHADER_PRESHADEROP_RCP; break;
            case 0x1040: opcode = MOJOSHADER_PRESHADEROP_FRC; break;
            case 0x1050: opcode = MOJOSHADER_PRESHADEROP_EXP; break;
            case 0x1060: opcode = MOJOSHADER_PRESHADEROP_LOG; break;
            case 0x1070: opcode = MOJOSHADER_PRESHADEROP_RSQ; break;
            case 0x1080: opcode = MOJOSHADER_PRESHADEROP_SIN; break;
            case 0x1090: opcode = MOJOSHADER_PRESHADEROP_COS; break;
            case 0x10A0: opcode = MOJOSHADER_PRESHADEROP_ASIN; break;
            case 0x10B0: opcode = MOJOSHADER_PRESHADEROP_ACOS; break;
            case 0x10C0: opcode = MOJOSHADER_PRESHADEROP_ATAN; break;
            case 0x2000: opcode = MOJOSHADER_PRESHADEROP_MIN; break;
            case 0x2010: opcode = MOJOSHADER_PRESHADEROP_MAX; break;
            case 0x2020: opcode = MOJOSHADER_PRESHADEROP_LT; break;
            case 0x2030: opcode = MOJOSHADER_PRESHADEROP_GE; break;
            case 0x2040: opcode = MOJOSHADER_PRESHADEROP_ADD; break;
            case 0x2050: opcode = MOJOSHADER_PRESHADEROP_MUL; break;
            case 0x2060: opcode = MOJOSHADER_PRESHADEROP_ATAN2; break;
            case 0x2080: opcode = MOJOSHADER_PRESHADEROP_DIV; break;
            case 0x3000: opcode = MOJOSHADER_PRESHADEROP_CMP; break;
            case 0x3010: opcode = MOJOSHADER_PRESHADEROP_MOVC; break;
            case 0x5000: opcode = MOJOSHADER_PRESHADEROP_DOT; break;
            case 0x5020: opcode = MOJOSHADER_PRESHADEROP_NOISE; break;
            case 0xA000: opcode = MOJOSHADER_PRESHADEROP_MIN_SCALAR; break;
            case 0xA010: opcode = MOJOSHADER_PRESHADEROP_MAX_SCALAR; break;
            case 0xA020: opcode = MOJOSHADER_PRESHADEROP_LT_SCALAR; break;
            case 0xA030: opcode = MOJOSHADER_PRESHADEROP_GE_SCALAR; break;
            case 0xA040: opcode = MOJOSHADER_PRESHADEROP_ADD_SCALAR; break;
            case 0xA050: opcode = MOJOSHADER_PRESHADEROP_MUL_SCALAR; break;
            case 0xA060: opcode = MOJOSHADER_PRESHADEROP_ATAN2_SCALAR; break;
            case 0xA080: opcode = MOJOSHADER_PRESHADEROP_DIV_SCALAR; break;
            case 0xD000: opcode = MOJOSHADER_PRESHADEROP_DOT_SCALAR; break;
            case 0xD020: opcode = MOJOSHADER_PRESHADEROP_NOISE_SCALAR; break;
            default: fail(ctx, "Unknown preshader opcode."); break;
        } // switch

        uint32 operand_count = SWAP32(fxlc.tokens[1]) + 1;  // +1 for dest.

        inst->opcode = opcode;
        inst->element_count = (unsigned int) (opcodetok & 0xFF);
        inst->operand_count = (unsigned int) operand_count;

        fxlc.tokens += 2;
        fxlc.tokcount -= 2;
        if ((operand_count * 3) > fxlc.tokcount)
        {
            fail(ctx, "Bogus preshader FXLC block.");
            return;
        } // if

        MOJOSHADER_preshaderOperand *operand = inst->operands;
        while (operand_count--)
        {
            const unsigned int item = (unsigned int) SWAP32(fxlc.tokens[2]);

            // !!! FIXME: Is this used anywhere other than INPUT? -flibit
            const uint32 numarrays = SWAP32(fxlc.tokens[0]);
            switch (SWAP32(fxlc.tokens[1]))
            {
                case 1:  // literal from CLIT block.
                {
                    if (item > preshader->literal_count)
                    {
                        fail(ctx, "Bogus preshader literal index.");
                        break;
                    } // if
                    operand->type = MOJOSHADER_PRESHADEROPERAND_LITERAL;
                    break;
                } // case

                case 2:  // item from ctabdata.
                {
                    MOJOSHADER_symbol *sym = ctabdata.symbols;
                    const uint32 symcount = (uint32) ctabdata.symbol_count;
                    for (i = 0; i < symcount; i++, sym++)
                    {
                        const uint32 base = sym->register_index * 4;
                        const uint32 count = sym->register_count * 4;
                        assert(sym->register_set==MOJOSHADER_SYMREGSET_FLOAT4);
                        if ( (base <= item) && ((base + count) > item) )
                            break;
                    } // for
                    if (i == ctabdata.symbol_count)
                    {
                        fail(ctx, "Bogus preshader input index.");
                        break;
                    } // if
                    operand->type = MOJOSHADER_PRESHADEROPERAND_INPUT;
                    if (numarrays > 0)
                    {
                        // malloc the array symbol name array
                        const uint32 siz = numarrays * sizeof (uint32);
                        operand->array_register_count = numarrays;
                        operand->array_registers = (uint32 *) Malloc(ctx, siz);
                        memset(operand->array_registers, '\0', siz);
                        // Get each register base, indicating the arrays used.
                        // !!! FIXME: fail if fxlc.tokcount*2 > numarrays ?
                        for (i = 0; i < numarrays; i++)
                        {
                            const uint32 jmp = SWAP32(fxlc.tokens[4]);
                            const uint32 bigjmp = (jmp >> 4) * 4;
                            const uint32 ltljmp = (jmp >> 2) & 3;
                            operand->array_registers[i] = bigjmp + ltljmp;
                            fxlc.tokens += 2;
                            fxlc.tokcount -= 2;
                        } // for
                    } // if
                    break;
                } // case

                case 4:
                {
                    operand->type = MOJOSHADER_PRESHADEROPERAND_OUTPUT;

                    for (i = 0; i < output_map_count; i++)
                    {
                        const uint32 base = output_map[(i*2)] * 4;
                        const uint32 count = output_map[(i*2)+1] * 4;
                        if ( (base <= item) && ((base + count) > item) )
                            break;
                    } // for

                    if (i == output_map_count)
                    {
                        if (prsi.seen)  // No PRSI tokens, no output map.
                            fail(ctx, "Bogus preshader output index.");
                    } // if

                    break;
                } // case

                case 7:
                {
                    operand->type = MOJOSHADER_PRESHADEROPERAND_TEMP;
                    if (item >= preshader->temp_count)
                        preshader->temp_count = item + 1;
                    break;
                } // case
            } // switch

            operand->index = item;

            fxlc.tokens += 3;
            fxlc.tokcount -= 3;
            operand++;
        } // while

        inst++;
    } // while

    // Registers need to be vec4, round up to nearest 4
    preshader->temp_count = (preshader->temp_count + 3) & ~3;

    unsigned int largest = 0;
    const MOJOSHADER_symbol *sym = preshader->symbols;
    const uint32 symcount = (uint32) preshader->symbol_count;
    for (i = 0; i < symcount; i++, sym++)
    {
        const unsigned int val = sym->register_index + sym->register_count;
        if (val > largest)
            largest = val;
    } // for

    if (largest > 0)
    {
        const size_t len = largest * sizeof (float) * 4;
        preshader->registers = (float *) Malloc(ctx, len);
        memset(preshader->registers, '\0', len);
        preshader->register_count = largest;
    } // if
#endif
}